

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

int __thiscall GrcSymbolTableEntry::GlyphMetricEngineCodeOp(GrcSymbolTableEntry *this)

{
  int iVar1;
  GrcSymbolTableEntry *this_00;
  string staField0;
  string staField1;
  string staField2;
  string local_68;
  string local_48;
  string local_28;
  
  do {
    this_00 = this;
    if (this_00->m_fGeneric != false) break;
    this = this_00->m_psymGeneric;
  } while (this_00->m_psymGeneric != (Symbol)0x0);
  FieldAt_abi_cxx11_(&local_68,this_00,0);
  FieldAt_abi_cxx11_(&local_48,this_00,1);
  FieldAt_abi_cxx11_(&local_28,this_00,2);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 2;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 3;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 4;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 5;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 7;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = 6;
          goto LAB_00170993;
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar1 == 0) {
          iVar1 = 8;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar1 == 0) {
          iVar1 = 9;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar1 == 0) {
          iVar1 = 10;
          goto LAB_00170993;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar1 == 0) {
          iVar1 = 0xb;
          goto LAB_00170993;
        }
      }
      iVar1 = -1;
    }
  }
LAB_00170993:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int GrcSymbolTableEntry::GlyphMetricEngineCodeOp()
{
	if (!m_fGeneric && m_psymGeneric)
		return m_psymGeneric->GlyphMetricEngineCodeOp();

	Assert(FitsSymbolType(ksymtGlyphMetric)) ;

	std::string staField0 = FieldAt(0);
	std::string staField1 = FieldAt(1);
	std::string staField2 = FieldAt(2);

	if (staField0 == "leftsidebearing")
	{
		return kgmetLsb;
	}
	else if (staField0 == "rightsidebearing")
	{
		return kgmetRsb;
	}
	else if (staField0 == "boundingbox")
	{
		if (staField1 == "top")
			return kgmetBbTop;
		else if (staField1 == "bottom")
			return kgmetBbBottom;
		else if (staField1 == "left")
			return kgmetBbLeft;
		else if (staField1 == "right")
			return kgmetBbRight;
		else if (staField1 == "width")
			return kgmetBbWidth;
		else if (staField1 == "height")
			return kgmetBbHeight;
		else
		{
			Assert(false);
		}
	}
	else if (staField0 == "advancewidth")
	{
		return kgmetAdvWidth;
	}
	else if (staField0 == "advanceheight")
	{
		return kgmetAdvHeight;
	}
//	else if (staField0 == "advance")
//	{
//		if (staField1 == "width")
//			return kgmetAdvWidth;
//		else if (staField1 == "height")
//			return kgmetAdvHeight;
//		else
//			Assert(false);
//	}
	else if (staField0 == "ascent")
	{
		return kgmetAscent;
	}
	else if (staField0 == "descent")
	{
		return kgmetDescent;
	}
	else
	{
		Assert(false);
    }
	return -1;
}